

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

from_chars_result __thiscall
semver::detail::version_parser::parse_build_identifier(version_parser *this,string *out)

{
  pointer ptVar1;
  token_stream *ptVar2;
  char *pcVar3;
  size_t sVar4;
  pointer ptVar5;
  undefined8 uVar6;
  char **ppcVar7;
  long lVar8;
  from_chars_result fVar9;
  token token;
  string result;
  undefined8 local_60;
  char *pcStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  ptVar2 = this->stream;
  ptVar1 = (ptVar2->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start + ptVar2->current;
  local_60._0_1_ = ptVar1->type;
  local_60._1_2_ = ptVar1->value;
  local_60._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
  pcStack_58 = ptVar1->lexeme;
  ptVar2->current = ptVar2->current + 1;
  ppcVar7 = &pcStack_58;
  do {
    if ((char)local_60 == '\x06') {
      std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> *)
                 ((long)&local_60 + 1));
      std::__cxx11::string::push_back((char)&local_50);
    }
    else {
      if ((char)local_60 == '\x05') {
        std::get<2UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                  ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator> *)
                   ((long)&local_60 + 1));
      }
      else if ((char)local_60 != '\x04') {
        uVar6 = 0x16;
        goto LAB_00103fd0;
      }
      std::__cxx11::string::push_back((char)&local_50);
    }
    ptVar2 = this->stream;
    sVar4 = ptVar2->current;
    ptVar5 = (ptVar2->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar8 = sVar4 * 0x10;
    ptVar1 = ptVar5 + sVar4;
    uVar6._0_1_ = ptVar1->type;
    uVar6._1_2_ = ptVar1->value;
    uVar6._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
    if ((undefined1)uVar6 != '\x04') {
      sVar4 = ptVar2->current;
      ptVar5 = (ptVar2->tokens).
               super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar8 = sVar4 * 0x10;
      ptVar1 = ptVar5 + sVar4;
      uVar6._0_1_ = ptVar1->type;
      uVar6._1_2_ = ptVar1->value;
      uVar6._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
      if ((undefined1)uVar6 != '\x05') {
        sVar4 = ptVar2->current;
        ptVar5 = (ptVar2->tokens).
                 super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar8 = sVar4 * 0x10;
        ptVar1 = ptVar5 + sVar4;
        uVar6._0_1_ = ptVar1->type;
        uVar6._1_2_ = ptVar1->value;
        uVar6._3_5_ = *(undefined5 *)&ptVar1->field_0x3;
        if ((undefined1)uVar6 != '\x06') {
          std::__cxx11::string::_M_assign((string *)out);
          ppcVar7 = &(this->stream->tokens).
                     super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>
                     ._M_impl.super__Vector_impl_data._M_start[this->stream->current].lexeme;
          uVar6 = 0;
LAB_00103fd0:
          pcVar3 = *ppcVar7;
          if (local_50 != &local_40) {
            operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
          fVar9.super_from_chars_result._8_8_ = uVar6;
          fVar9.super_from_chars_result.ptr = pcVar3;
          return (from_chars_result)fVar9.super_from_chars_result;
        }
      }
    }
    pcStack_58 = *(char **)((long)&ptVar5->lexeme + lVar8);
    ptVar2->current = sVar4 + 1;
    local_60 = uVar6;
  } while( true );
}

Assistant:

parse_build_identifier(std::string& out) {
    std::string result;
    token token = stream.advance();

    do {
      switch (token.type) {
      case token_type::hyphen:
        result.push_back('-');
        break;
      case token_type::letter:
        result.push_back(std::get<char>(token.value));
        break;
      case token_type::digit:
      {
        const auto digit = std::get<std::uint8_t>(token.value);
        result.push_back(to_char(digit));
        break;
      }
      default:
        return failure(token.lexeme);
      }
    } while (stream.advanceIfMatch(token, token_type::hyphen) || stream.advanceIfMatch(token, token_type::letter) || stream.advanceIfMatch(token, token_type::digit));

    out = result;
    return success(stream.peek().lexeme);
  }